

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_Module_Interface cff_get_interface(FT_Module driver,char *module_interface)

{
  FT_Module pFVar1;
  FT_Module local_40;
  FT_Module_Interface result;
  FT_Module sfnt;
  FT_Library library;
  char *module_interface_local;
  FT_Module driver_local;
  
  driver_local = (FT_Module)ft_service_list_lookup(cff_services,module_interface);
  if (driver_local == (FT_Module)0x0) {
    if (driver == (FT_Module)0x0) {
      driver_local = (FT_Module)0x0;
    }
    else if (driver->library == (FT_Library)0x0) {
      driver_local = (FT_Module)0x0;
    }
    else {
      pFVar1 = FT_Get_Module(driver->library,"sfnt");
      if (pFVar1 == (FT_Module)0x0) {
        local_40 = (FT_Module)0x0;
      }
      else {
        local_40 = (FT_Module)(*pFVar1->clazz->get_interface)(pFVar1,module_interface);
      }
      driver_local = local_40;
    }
  }
  return driver_local;
}

Assistant:

FT_CALLBACK_DEF( FT_Module_Interface )
  cff_get_interface( FT_Module    driver,       /* CFF_Driver */
                     const char*  module_interface )
  {
    FT_Library           library;
    FT_Module            sfnt;
    FT_Module_Interface  result;


    /* CFF_SERVICES_GET dereferences `library' in PIC mode */
#ifdef FT_CONFIG_OPTION_PIC
    if ( !driver )
      return NULL;
    library = driver->library;
    if ( !library )
      return NULL;
#endif

    result = ft_service_list_lookup( CFF_SERVICES_GET, module_interface );
    if ( result )
      return result;

    /* `driver' is not yet evaluated in non-PIC mode */
#ifndef FT_CONFIG_OPTION_PIC
    if ( !driver )
      return NULL;
    library = driver->library;
    if ( !library )
      return NULL;
#endif

    /* we pass our request to the `sfnt' module */
    sfnt = FT_Get_Module( library, "sfnt" );

    return sfnt ? sfnt->clazz->get_interface( sfnt, module_interface ) : 0;
  }